

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode Curl_do_more(connectdata *conn,_Bool *completed)

{
  Curl_do_more_func p_Var1;
  SessionHandle *data;
  CURLcode CVar2;
  int iVar3;
  
  *completed = false;
  p_Var1 = conn->handler->do_more;
  if (p_Var1 == (Curl_do_more_func)0x0) {
    CVar2 = CURLE_OK;
  }
  else {
    CVar2 = (*p_Var1)(conn,completed);
  }
  if ((CVar2 == CURLE_OK) && (*completed == true)) {
    data = conn->data;
    (data->req).chunk = false;
    iVar3 = conn->writesockfd;
    if (conn->writesockfd < conn->sockfd) {
      iVar3 = conn->sockfd;
    }
    (data->req).maxfd = iVar3 + 1;
    Curl_pgrsTime(data,TIMER_PRETRANSFER);
  }
  return CVar2;
}

Assistant:

CURLcode Curl_do_more(struct connectdata *conn, bool *completed)
{
  CURLcode result=CURLE_OK;

  *completed = FALSE;

  if(conn->handler->do_more)
    result = conn->handler->do_more(conn, completed);

  if(!result && *completed)
    /* do_complete must be called after the protocol-specific DO function */
    do_complete(conn);

  return result;
}